

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Port::assign_(Port *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  UserException *this_00;
  StmtException *this_01;
  undefined4 in_register_00000014;
  long *plVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  byte bVar5;
  shared_ptr<kratos::AssignStmt> sVar6;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  IRNode *local_c8;
  long local_c0;
  _func_int **local_b8;
  element_type *peStack_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::VarCasted> casted;
  allocator_type local_32;
  byte local_31;
  
  plVar4 = (long *)CONCAT44(in_register_00000014,type);
  if (*plVar4 == 0) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_78,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,
                   "Trying to assign null to ",&local_78);
    UserException::UserException(this_00,(string *)auStack_58);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)(*plVar4 + 0x168);
  if (iVar1 - 3U < 2) goto LAB_00249a39;
  iVar2 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
  bVar5 = iVar2 == 0;
  if (iVar1 == 6) {
    local_31 = iVar2 == 0;
    Var::as<kratos::VarCasted>((Var *)auStack_58);
    iVar1 = *(int *)((long)auStack_58 + 0x280);
    bVar3 = (*(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 4) == 2 && iVar1 == 3) | local_31;
    if (iVar1 == 2) {
      bVar5 = 1;
      if (*(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4) != 1) {
LAB_00249a22:
        bVar5 = bVar3;
      }
    }
    else if (iVar1 == 4) {
      bVar5 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 4) == 4 | bVar3;
    }
    else if ((iVar1 != 5) ||
            (bVar5 = 1,
            *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4) != 3)) goto LAB_00249a22;
    if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if ((bVar5 & 1) == 0) {
    this_01 = (StmtException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)*plVar4 + 0xf8))(&local_b8);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(local_98,var);
    auStack_58 = (undefined1  [8])local_b8;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_b0;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98[0];
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x38;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_58;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_78,(detail *)"Typing error. Cannot assign variable ({0}) to port ({1})",
               format_str,args);
    local_c0 = *plVar4;
    __l._M_len = 2;
    __l._M_array = &local_c8;
    local_c8 = (IRNode *)var;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
               &local_32);
    StmtException::StmtException
              (this_01,&local_78,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
    __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00249a39:
  sVar6 = Var::assign_(&this->super_Var,var,type);
  sVar6.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar6.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Port::assign_(const std::shared_ptr<Var>& var,
                                          enum kratos::AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // notice that we have the following rules
    // var <- port. this is considered as a lower cast, hence it's allowed
    // port <- var. this is considered as an upper cast, which needs explicit casting
    if (var->type() != VarType::PortIO && var->type() != VarType::ConstValue) {
        bool allowed = port_type() == PortType::Data;
        if (var->type() == VarType::BaseCasted) {
            auto casted = var->as<VarCasted>();
            auto cast_type = casted->cast_type();
            if (cast_type == VarCastType::AsyncReset && port_type() == PortType::AsyncReset)
                allowed = true;  // NOLINT
            if (cast_type == VarCastType::Reset && port_type() == PortType::Reset)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::Clock && port_type() == PortType::Clock)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::ClockEnable && port_type() == PortType::ClockEnable)
                allowed = true;  // NOLINT
        }
        if (!allowed) {
            throw StmtException(::format("Typing error. Cannot assign variable ({0}) to port ({1})",
                                         var->to_string(), to_string()),
                                {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}